

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

void encode_in_place(lzma_delta_coder *coder,uint8_t *buffer,size_t size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  size_t sVar4;
  ulong uStack_30;
  uint8_t tmp;
  size_t i;
  size_t distance;
  size_t size_local;
  uint8_t *buffer_local;
  lzma_delta_coder *coder_local;
  
  sVar4 = coder->distance;
  for (uStack_30 = 0; uStack_30 < size; uStack_30 = uStack_30 + 1) {
    uVar1 = coder->history[sVar4 + coder->pos & 0xff];
    uVar2 = buffer[uStack_30];
    bVar3 = coder->pos;
    coder->pos = bVar3 - 1;
    coder->history[(int)(uint)bVar3] = uVar2;
    buffer[uStack_30] = buffer[uStack_30] - uVar1;
  }
  return;
}

Assistant:

static void
encode_in_place(lzma_delta_coder *coder, uint8_t *buffer, size_t size)
{
	const size_t distance = coder->distance;

	for (size_t i = 0; i < size; ++i) {
		const uint8_t tmp = coder->history[
				(distance + coder->pos) & 0xFF];
		coder->history[coder->pos-- & 0xFF] = buffer[i];
		buffer[i] -= tmp;
	}
}